

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v3.cpp
# Opt level: O0

int __thiscall
LASwriteItemCompressed_RGB14_v3::init(LASwriteItemCompressed_RGB14_v3 *this,EVP_PKEY_CTX *ctx)

{
  BOOL BVar1;
  ByteStreamOutArrayLE *this_00;
  ByteStreamOutArrayBE *this_01;
  ArithmeticEncoder *this_02;
  undefined7 extraout_var;
  U32 *in_RDX;
  uint local_30;
  U32 c;
  U32 *context_local;
  U8 *item_local;
  LASwriteItemCompressed_RGB14_v3 *this_local;
  
  if (this->outstream_RGB == (ByteStreamOutArray *)0x0) {
    BVar1 = IS_LITTLE_ENDIAN();
    if (BVar1) {
      this_00 = (ByteStreamOutArrayLE *)operator_new(0x40);
      ByteStreamOutArrayLE::ByteStreamOutArrayLE(this_00,0x1000);
      this->outstream_RGB = (ByteStreamOutArray *)this_00;
    }
    else {
      this_01 = (ByteStreamOutArrayBE *)operator_new(0x40);
      ByteStreamOutArrayBE::ByteStreamOutArrayBE(this_01,0x1000);
      this->outstream_RGB = (ByteStreamOutArray *)this_01;
    }
    this_02 = (ArithmeticEncoder *)operator_new(0x30);
    ArithmeticEncoder::ArithmeticEncoder(this_02);
    this->enc_RGB = this_02;
  }
  else {
    (*(this->outstream_RGB->super_ByteStreamOut)._vptr_ByteStreamOut[10])(this->outstream_RGB,0);
  }
  ArithmeticEncoder::init(this->enc_RGB,(EVP_PKEY_CTX *)this->outstream_RGB);
  this->changed_RGB = false;
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    this->contexts[local_30].unused = true;
  }
  this->current_context = *in_RDX;
  createAndInitModelsAndCompressors(this,this->current_context,(U8 *)ctx);
  return (int)CONCAT71(extraout_var,1);
}

Assistant:

BOOL LASwriteItemCompressed_RGB14_v3::init(const U8* item, U32& context)
{
  /* on the first init create outstreams and encoders */

  if (outstream_RGB == 0)
  {
    /* create outstreams */

    if (IS_LITTLE_ENDIAN())
    {
      outstream_RGB = new ByteStreamOutArrayLE();
    }
    else
    {
      outstream_RGB = new ByteStreamOutArrayBE();
    }

    /* create layer encoders */

    enc_RGB = new ArithmeticEncoder();
  }
  else
  {
    /* otherwise just seek back */

    outstream_RGB->seek(0);
  }
  
  /* init layer encoders */

  enc_RGB->init(outstream_RGB);

  /* set changed booleans to FALSE */

  changed_RGB = FALSE;

  /* mark the four scanner channel contexts as unused */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].unused = TRUE;
  }

  /* set scanner channel as current context */

  current_context = context; // all other items use context set by POINT14 writer

  /* create and init entropy models and integer compressors (and init contect from item) */

  createAndInitModelsAndCompressors(current_context, item);

  return TRUE;
}